

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::remove_attributes(xml_node *this)

{
  xml_node_struct *pxVar1;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar2;
  char_t *pcVar3;
  long lVar4;
  ulong uVar5;
  xml_node_struct *pxVar6;
  xml_memory_page *in_RCX;
  void *pvVar7;
  xml_attribute_struct *pxVar8;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar6 = pxVar1;
    if (pxVar1->first_attribute != (xml_attribute_struct *)0x0) {
      this_00 = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
      pxVar8 = pxVar1->first_attribute;
      do {
        uVar5 = pxVar8->header;
        pxVar2 = pxVar8->next_attribute;
        if ((uVar5 & 0x20) != 0) {
          pcVar3 = pxVar8->name;
          in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar3 + -4) * 8);
          lVar4 = (ulong)*(ushort *)(pcVar3 + -4) * -8;
          if (*(ushort *)(pcVar3 + -2) == 0) {
            pvVar7 = *(void **)(pcVar3 + lVar4 + -0x14);
          }
          else {
            pvVar7 = (void *)((ulong)*(ushort *)(pcVar3 + -2) << 3);
          }
          impl::anon_unknown_0::xml_allocator::deallocate_memory
                    (this_00,pvVar7,(size_t)(pcVar3 + lVar4 + -0x2c),in_RCX);
          uVar5 = pxVar8->header;
        }
        if ((uVar5 & 0x10) != 0) {
          pcVar3 = pxVar8->value;
          in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar3 + -4) * 8);
          lVar4 = (ulong)*(ushort *)(pcVar3 + -4) * -8;
          if (*(ushort *)(pcVar3 + -2) == 0) {
            pvVar7 = *(void **)(pcVar3 + lVar4 + -0x14);
          }
          else {
            pvVar7 = (void *)((ulong)*(ushort *)(pcVar3 + -2) << 3);
          }
          impl::anon_unknown_0::xml_allocator::deallocate_memory
                    (this_00,pvVar7,(size_t)(pcVar3 + lVar4 + -0x2c),in_RCX);
          uVar5 = pxVar8->header;
        }
        impl::anon_unknown_0::xml_allocator::deallocate_memory
                  (this_00,(void *)0x28,(long)pxVar8 - (uVar5 >> 8),in_RCX);
        pxVar8 = pxVar2;
      } while (pxVar2 != (xml_attribute_struct *)0x0);
      pxVar6 = this->_root;
    }
    pxVar6->first_attribute = (xml_attribute_struct *)0x0;
  }
  return pxVar1 != (xml_node_struct *)0x0;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attributes()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_attribute_struct* attr = _root->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			impl::destroy_attribute(attr, alloc);

			attr = next;
		}

		_root->first_attribute = NULL;

		return true;
	}